

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O3

void solve(grid *b,uint idx)

{
  run *prVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  _Base_bitset<1UL> _Var5;
  pointer prVar6;
  _Base_bitset<1UL> _Var7;
  logic_error *this;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  char local_29;
  
  uVar8 = b->cols_;
  uVar3 = b->rows_ * uVar8;
  if (idx < uVar3) {
    lVar10 = (ulong)idx << 4;
    lVar9 = 0;
    do {
      if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(ulong)idx + lVar9] != 0xffffffff) {
        prVar6 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        prVar1 = *(run **)((long)prVar6->r_ + lVar10);
        if (prVar1 == (run *)0x0) {
          _Var5._M_w = 0;
        }
        else {
          _Var5._M_w = (_WordT)feasible_addend_set(prVar1);
          prVar6 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        prVar1 = *(run **)((long)prVar6->r_ + lVar10 + 8);
        if (prVar1 == (run *)0x0) {
          _Var7._M_w = 0;
        }
        else {
          _Var7._M_w = (_WordT)feasible_addend_set(prVar1);
        }
        uVar8 = idx + (int)lVar9;
        uVar11 = 1;
        do {
          if (((_Var7._M_w & _Var5._M_w) >> (uVar11 & 0x3f) & 1) != 0) {
            bVar2 = grid::put(b,uVar8,(uint)uVar11);
            if (!bVar2) {
              this = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this,"duplicate trial number");
              __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            solve(b,idx + (int)lVar9 + 1);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 10);
        grid::put(b,uVar8,0);
        return;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while ((idx - uVar3) + (int)lVar9 != 0);
  }
  if (uVar3 != 0) {
    uVar11 = 0;
    do {
      if ((int)((uVar11 & 0xffffffff) % (ulong)uVar8) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] == 0xffffffff) {
        local_29 = '.';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      }
      else {
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      uVar11 = uVar11 + 1;
      uVar8 = b->cols_;
    } while (uVar11 < b->rows_ * uVar8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

static void solve(grid &b, unsigned idx)
{
	/* if we come this far, the grid contains a solution */
	if(idx >= b.rows_ * b.cols_) {
		print(b);
		return;
	}

	/*
	  for coding simplicity, we always recurse, even on nonfillable cells.
	  so skip them here..
	*/
	if(b.cells_[idx] == -1U) {
		solve(b, idx+1);
		return;
	}

	bitset<10> trial_numbers = feasible_numbers(b, idx);
	for(unsigned i = 1; i < 10; i++)
		if(trial_numbers[i]) {
			/*
			  putting should always succeed since the trial number set is
			  calculated so that it contains only not present numbers.
			*/
			if(!b.put(idx, i))
				throw logic_error("duplicate trial number");
			solve(b, idx+1);
		}

	/* UNDO number placement before backtracking */
	b.put(idx, 0);
}